

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask10_16(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long unaff_RBP;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  vpmovsxbd_avx(ZEXT416(0x3024180c));
  auVar8 = vpmovsxbd_avx(ZEXT416(0x2020004));
  auVar3 = vpmovsxbd_avx(ZEXT416(0x606020a));
  vpmovsxbd_avx(ZEXT416(0x2c201408));
  auVar5 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)(in[4] << 8)));
  auVar6 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + unaff_RBP));
  auVar6 = vpsllvd_avx2(auVar6,_DAT_0019cbd0);
  auVar7 = vpermi2d_avx512vl(auVar8,auVar5,ZEXT416(in[1]));
  auVar8 = vpinsrd_avx(auVar7,in[7],2);
  auVar4 = vpsrlvd_avx2(auVar7,auVar3);
  auVar8 = vpsllvd_avx2(auVar8,auVar3);
  auVar7 = vpsllvd_avx2(auVar5,_DAT_0019c770);
  auVar3 = vpblendd_avx2(auVar8,auVar4,10);
  auVar8 = vpinsrd_avx(ZEXT416(*in),in[4] << 8,1);
  auVar8 = vpinsrd_avx(auVar8,auVar5._4_4_ >> 4,2);
  uVar1 = in[0xe];
  auVar8 = vpinsrd_avx(auVar8,in[10] << 4,3);
  uVar2 = in[0xd];
  auVar8 = vpor_avx(auVar3,auVar8);
  auVar8 = vpternlogd_avx512vl(auVar7,auVar6,auVar8,0xfe);
  *(undefined1 (*) [16])out = auVar8;
  out[4] = in[0xf] << 0x16 | uVar1 << 0xc | uVar2 << 2 | auVar5._12_4_ >> 8;
  return out + 5;
}

Assistant:

uint32_t *__fastpackwithoutmask10_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (10 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (10 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (10 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (10 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  ++in;

  return out;
}